

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asmcode.h
# Opt level: O2

void __thiscall
assembler::asmcode::
add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,std::__cxx11::string_const&>
          (asmcode *this,operation *val,operand *val_1,operand *val_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val_3)

{
  instruction ins;
  undefined1 local_50 [64];
  
  assembler::asmcode::instruction::instruction
            ((instruction *)local_50,*val,*val_1,*val_2,(string *)val_3);
  std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>::
  push_back((vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>
             *)(*(long *)(*(long *)(this + 0x20) + -8) + 0x10),(instruction *)local_50);
  std::__cxx11::string::~string((string *)(local_50 + 0x20));
  return;
}

Assistant:

void add(T&&... val)
      {
      instruction ins(std::forward<T>(val)...);
      (*instructions_list_stack.back()).push_back(ins);
      }